

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

bool __thiscall libcellml::Annotator::assignIds(Annotator *this,CellmlElementType type)

{
  int iVar1;
  pointer puVar2;
  int iVar3;
  LoggerImpl *pLVar4;
  size_t sVar5;
  AnnotatorImpl *pAVar6;
  ulong uVar7;
  bool bVar8;
  shared_ptr<libcellml::Model> model;
  ModelPtr local_50;
  ComponentEntity local_40;
  
  pLVar4 = Logger::pFunc(&this->super_Logger);
  local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       pLVar4[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  if (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count;
    do {
      if (iVar3 == 0) {
        local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi)->_M_use_count;
      bVar8 = iVar3 == iVar1;
      if (bVar8) {
        (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar8);
  }
  if (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar8 = true;
  }
  else {
    bVar8 = (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count == 0;
  }
  if (bVar8) {
    local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         pLVar4[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  }
  if (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pAVar6 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
    AnnotatorImpl::addIssueNoModel(pAVar6);
    bVar8 = false;
  }
  else {
    pLVar4 = Logger::pFunc(&this->super_Logger);
    puVar2 = pLVar4[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    switch(type) {
    case COMPONENT:
    case COMPONENT_REF:
    case CONNECTION:
    case MAP_VARIABLES:
    case RESET:
    case RESET_VALUE:
    case TEST_VALUE:
    case VARIABLE:
      for (uVar7 = 0;
          sVar5 = ComponentEntity::componentCount
                            (&(local_50.
                               super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_ComponentEntity), uVar7 < sVar5; uVar7 = uVar7 + 1) {
        pAVar6 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
        ComponentEntity::component
                  (&local_40,
                   (size_t)local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        AnnotatorImpl::doSetComponentTreeTypeIds(pAVar6,(ComponentPtr *)&local_40,type,false);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
        }
      }
      break;
    case ENCAPSULATION:
      pAVar6 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetEncapsulationIds(pAVar6);
      break;
    case IMPORT:
      pAVar6 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetImportSourceIds(pAVar6);
      break;
    case MODEL:
      pAVar6 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetModelIds(pAVar6);
      break;
    case UNIT:
      pAVar6 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetUnitsItemIds(pAVar6);
      break;
    case UNITS:
      pAVar6 = (AnnotatorImpl *)Logger::pFunc(&this->super_Logger);
      AnnotatorImpl::doSetUnitsIds(pAVar6);
    }
    setModel(this,&local_50);
    pLVar4 = Logger::pFunc(&this->super_Logger);
    bVar8 = puVar2 < pLVar4[1].mMessages.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  if (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return bVar8;
}

Assistant:

bool Annotator::assignIds(CellmlElementType type)
{
    auto model = pFunc()->mModel.lock();
    if (model == nullptr) {
        pFunc()->addIssueNoModel();
        return false;
    }

    size_t initialSize = pFunc()->idCount();

    switch (type) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF:
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
    case CellmlElementType::RESET:
    case CellmlElementType::RESET_VALUE:
    case CellmlElementType::TEST_VALUE:
    case CellmlElementType::VARIABLE:
        for (size_t index = 0; index < model->componentCount(); ++index) {
            pFunc()->doSetComponentTreeTypeIds(model->component(index), type);
        }
        break;
    case CellmlElementType::ENCAPSULATION:
        pFunc()->doSetEncapsulationIds();
        break;
    case CellmlElementType::IMPORT:
        pFunc()->doSetImportSourceIds();
        break;
    case CellmlElementType::MODEL:
        pFunc()->doSetModelIds();
        break;
    case CellmlElementType::UNIT:
        pFunc()->doSetUnitsItemIds();
        break;
    case CellmlElementType::UNITS:
        pFunc()->doSetUnitsIds();
        break;
    case CellmlElementType::MATH:
    default: /* case CellmlElementType::UNDEFINED */
        break;
    }

    setModel(model);

    return pFunc()->idCount() > initialSize;
}